

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

int OpenMD::SquareMatrix<double,_3>::jacobi
              (SquareMatrix<double,_3> *a,Vector<double,_3U> *w,SquareMatrix<double,_3> *v)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double zspace [10];
  double bspace [10];
  ulong local_130;
  double local_d8 [10];
  double adStack_88 [11];
  
  lVar5 = 0;
  pdVar6 = (double *)v;
  do {
    puVar1 = (undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar5 + 0x10) = 0;
    *pdVar6 = 1.0;
    pdVar6 = pdVar6 + 4;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar5 = 0;
  do {
    uVar3 = *(undefined8 *)((long)(a->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar5 * 4);
    *(undefined8 *)((long)w->data_ + lVar5) = uVar3;
    *(undefined8 *)((long)adStack_88 + lVar5) = uVar3;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  uVar12 = 0;
  do {
    dVar22 = 0.0;
    pdVar6 = (double *)a;
    lVar5 = 0;
    do {
      lVar11 = 1;
      do {
        dVar22 = dVar22 + ABS(pdVar6[lVar11]);
        lVar2 = lVar5 + lVar11;
        lVar11 = lVar11 + 1;
      } while (lVar2 != 2);
      pdVar6 = pdVar6 + 4;
      bVar17 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar17);
    if ((dVar22 == 0.0) && (!NAN(dVar22))) goto LAB_001d1374;
    dVar22 = (dVar22 * 0.2) / 9.0;
    if (2 < uVar12) {
      dVar22 = 0.0;
    }
    uVar15 = 1;
    local_130 = 0;
    pdVar7 = (double *)v;
    pdVar6 = (v->super_RectMatrix<double,_3U,_3U>).data_[0];
    do {
      pdVar6 = pdVar6 + 1;
      pdVar14 = (a->super_RectMatrix<double,_3U,_3U>).data_[local_130] + 1;
      pdVar13 = pdVar6;
      uVar16 = uVar15;
      do {
        pdVar8 = pdVar14 + (uVar16 - 1);
        dVar21 = *pdVar8;
        dVar18 = ABS(dVar21) * 100.0;
        if (uVar12 < 4) {
LAB_001d1027:
          if (dVar22 < ABS(dVar21)) {
            dVar20 = w->data_[uVar16] - w->data_[local_130];
            dVar19 = ABS(dVar20);
            if ((dVar18 + dVar19 != dVar19) || (NAN(dVar18 + dVar19) || NAN(dVar19))) {
              dVar18 = (dVar20 * 0.5) / dVar21;
              dVar21 = dVar18 * dVar18 + 1.0;
              if (dVar21 < 0.0) {
                dVar21 = sqrt(dVar21);
              }
              else {
                dVar21 = SQRT(dVar21);
              }
              dVar21 = 1.0 / (ABS(dVar18) + dVar21);
              if (dVar18 < 0.0) {
                dVar21 = -dVar21;
              }
            }
            else {
              dVar21 = dVar21 / dVar20;
            }
            dVar18 = dVar21 * dVar21 + 1.0;
            if (dVar18 < 0.0) {
              dVar18 = sqrt(dVar18);
            }
            else {
              dVar18 = SQRT(dVar18);
            }
            dVar19 = dVar21 * (1.0 / dVar18);
            dVar21 = dVar21 * *pdVar8;
            local_d8[local_130] = local_d8[local_130] - dVar21;
            local_d8[uVar16] = local_d8[uVar16] + dVar21;
            w->data_[local_130] = w->data_[local_130] - dVar21;
            dVar18 = dVar19 / (1.0 / dVar18 + 1.0);
            w->data_[uVar16] = dVar21 + w->data_[uVar16];
            *pdVar8 = 0.0;
            if (local_130 == 1) {
              dVar21 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][1];
              dVar20 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar16];
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][1] =
                   dVar21 - (dVar21 * dVar18 + dVar20) * dVar19;
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar16] =
                   (dVar21 - dVar20 * dVar18) * dVar19 + dVar20;
            }
            if (local_130 + 1 < uVar16) {
              do {
                dVar21 = *pdVar14;
                dVar20 = (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar16];
                *pdVar14 = (dVar21 * dVar18 + dVar20) * -dVar19 + dVar21;
                (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar16] =
                     (dVar21 - dVar20 * dVar18) * dVar19 + dVar20;
              } while (2 < uVar16);
            }
            if (uVar16 != 2) {
              dVar21 = (a->super_RectMatrix<double,_3U,_3U>).data_[local_130][2];
              dVar20 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar16][2];
              (a->super_RectMatrix<double,_3U,_3U>).data_[local_130][2] =
                   dVar21 - (dVar21 * dVar18 + dVar20) * dVar19;
              (a->super_RectMatrix<double,_3U,_3U>).data_[uVar16][2] =
                   (dVar21 - dVar20 * dVar18) * dVar19 + dVar20;
            }
            lVar5 = 0;
            do {
              dVar21 = *(double *)((long)pdVar7 + lVar5);
              dVar20 = *(double *)((long)pdVar13 + lVar5);
              *(double *)((long)pdVar7 + lVar5) = (dVar21 * dVar18 + dVar20) * -dVar19 + dVar21;
              *(double *)((long)pdVar13 + lVar5) = (dVar21 - dVar20 * dVar18) * dVar19 + dVar20;
              lVar5 = lVar5 + 0x18;
            } while (lVar5 != 0x48);
          }
        }
        else {
          dVar19 = ABS(w->data_[local_130]);
          if ((dVar18 + dVar19 != dVar19) || (NAN(dVar18 + dVar19) || NAN(dVar19)))
          goto LAB_001d1027;
          dVar19 = ABS(w->data_[uVar16]);
          if ((dVar18 + dVar19 != dVar19) || (NAN(dVar18 + dVar19) || NAN(dVar19)))
          goto LAB_001d1027;
          *pdVar8 = 0.0;
        }
        uVar16 = uVar16 + 1;
        pdVar13 = pdVar13 + 1;
      } while (uVar16 != 3);
      uVar15 = uVar15 + 1;
      pdVar7 = pdVar7 + 1;
      bVar17 = local_130 == 0;
      local_130 = local_130 + 1;
    } while (bVar17);
    lVar5 = 0;
    do {
      dVar22 = adStack_88[lVar5];
      adStack_88[lVar5] = local_d8[lVar5] + dVar22;
      w->data_[lVar5] = local_d8[lVar5] + dVar22;
      local_d8[lVar5] = 0.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x14);
  uVar12 = 0x14;
LAB_001d1374:
  if (uVar12 < 0x14) {
    uVar16 = 1;
    pdVar6 = (double *)v;
    uVar15 = 0;
    do {
      uVar10 = uVar15 & 0xffffffff;
      uVar9 = uVar16;
      dVar22 = w->data_[uVar15];
      do {
        dVar21 = w->data_[uVar9];
        if (dVar22 <= dVar21) {
          uVar10 = uVar9 & 0xffffffff;
        }
        dVar22 = (double)(-(ulong)(dVar21 < dVar22) & (ulong)dVar22 |
                         ~-(ulong)(dVar21 < dVar22) & (ulong)dVar21);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
      if (uVar15 != uVar10) {
        w->data_[uVar10] = w->data_[uVar15];
        w->data_[uVar15] = dVar22;
        lVar5 = 0;
        do {
          uVar3 = *(undefined8 *)((long)pdVar6 + lVar5);
          *(undefined8 *)((long)pdVar6 + lVar5) =
               *(undefined8 *)
                ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar5 + uVar10 * 8);
          *(undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar5 + uVar10 * 8)
               = uVar3;
          lVar5 = lVar5 + 0x18;
        } while (lVar5 != 0x48);
      }
      uVar16 = uVar16 + 1;
      pdVar6 = pdVar6 + 1;
      bVar17 = uVar15 == 0;
      uVar15 = uVar15 + 1;
    } while (bVar17);
    lVar5 = 0;
    do {
      lVar11 = -0x48;
      uVar12 = 0;
      do {
        uVar12 = (uVar12 + 1) - (uint)(*(double *)((long)v + lVar11 + 0x48) < 0.0);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0);
      if (uVar12 < 2) {
        lVar11 = 0;
        do {
          *(ulong *)((long)v + lVar11) = *(ulong *)((long)v + lVar11) ^ 0x8000000000000000;
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != 0x48);
      }
      lVar5 = lVar5 + 1;
      v = (SquareMatrix<double,_3> *)((long)v + 8);
    } while (lVar5 != 3);
    iVar4 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SquareMatrix::Jacobi: Error extracting eigenfunctions",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int SquareMatrix<Real, Dim>::jacobi(SquareMatrix<Real, Dim>& a,
                                      Vector<Real, Dim>& w,
                                      SquareMatrix<Real, Dim>& v) {
    const int n = Dim;
    int i, j, k, iq, ip, numPos;
    Real tresh, theta, tau, t, sm, s, h, g, c, tmp;
    Real bspace[MAX_SCRATCH_ARRAY_SIZE], zspace[MAX_SCRATCH_ARRAY_SIZE];
    Real* b = (n <= MAX_SCRATCH_ARRAY_SIZE) ? bspace : new Real[n];
    Real* z = (n <= MAX_SCRATCH_ARRAY_SIZE) ? zspace : new Real[n];

    // initialize
    for (ip = 0; ip < n; ip++) {
      for (iq = 0; iq < n; iq++) {
        v(ip, iq) = 0.0;
      }
      v(ip, ip) = 1.0;
    }
    for (ip = 0; ip < n; ip++) {
      b[ip] = w[ip] = a(ip, ip);
      z[ip]         = 0.0;
    }

    // begin rotation sequence
    for (i = 0; i < MAX_ROTATIONS; ++i) {
      sm = 0.0;
      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          sm += std::abs(a(ip, iq));
        }
      }
      if (sm == 0.0) { break; }

      if (i < 3) {  // first 3 sweeps
        tresh = 0.2 * sm / (n * n);
      } else {
        tresh = 0.0;
      }

      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          g = 100.0 * std::abs(a(ip, iq));

          // after 4 sweeps
          if (i > 3 && (std::abs(w[ip]) + g) == std::abs(w[ip]) &&
              (std::abs(w[iq]) + g) == std::abs(w[iq])) {
            a(ip, iq) = 0.0;
          } else if (std::abs(a(ip, iq)) > tresh) {
            h = w[iq] - w[ip];
            if ((std::abs(h) + g) == std::abs(h)) {
              t = (a(ip, iq)) / h;
            } else {
              theta = 0.5 * h / (a(ip, iq));
              t     = 1.0 / (std::abs(theta) + std::sqrt(1.0 + theta * theta));
              if (theta < 0.0) { t = -t; }
            }
            c   = 1.0 / std::sqrt(1 + t * t);
            s   = t * c;
            tau = s / (1.0 + c);
            h   = t * a(ip, iq);
            z[ip] -= h;
            z[iq] += h;
            w[ip] -= h;
            w[iq] += h;
            a(ip, iq) = 0.0;

            // ip already shifted left by 1 unit
            for (j = 0; j <= ip - 1; ++j) {
              ROTATE(a, j, ip, j, iq);
            }
            // ip and iq already shifted left by 1 unit
            for (j = ip + 1; j <= iq - 1; ++j) {
              ROTATE(a, ip, j, j, iq);
            }
            // iq already shifted left by 1 unit
            for (j = iq + 1; j < n; ++j) {
              ROTATE(a, ip, j, iq, j);
            }
            for (j = 0; j < n; ++j) {
              ROTATE(v, j, ip, j, iq);
            }
          }
        }
      }

      for (ip = 0; ip < n; ip++) {
        b[ip] += z[ip];
        w[ip] = b[ip];
        z[ip] = 0.0;
      }
    }

    //// this is NEVER called
    if (i >= MAX_ROTATIONS) {
      std::cout << "SquareMatrix::Jacobi: Error extracting eigenfunctions"
                << std::endl;
      if (n > MAX_SCRATCH_ARRAY_SIZE) {
        delete[] b;
        delete[] z;
      }
      return 0;
    }

    // sort eigenfunctions             these changes do not affect accuracy
    for (j = 0; j < n - 1; ++j) {  // boundary incorrect
      k   = j;
      tmp = w[k];
      for (i = j + 1; i < n; ++i) {  // boundary incorrect, shifted already
        if (w[i] >= tmp) {           // why exchage if same?
          k   = i;
          tmp = w[k];
        }
      }
      if (k != j) {
        w[k] = w[j];
        w[j] = tmp;
        for (i = 0; i < n; i++) {
          tmp     = v(i, j);
          v(i, j) = v(i, k);
          v(i, k) = tmp;
        }
      }
    }
    // insure eigenvector consistency (i.e., Jacobi can compute
    // vectors that are negative of one another (.707,.707,0) and
    // (-.707,-.707,0). This can wreak havoc in other stuff. We will
    // select the most positive eigenvector.
    int ceil_half_n = (n >> 1) + (n & 1);
    for (j = 0; j < n; ++j) {
      for (numPos = 0, i = 0; i < n; ++i) {
        if (v(i, j) >= 0.0) { numPos++; }
      }
      if (numPos < ceil_half_n) {
        for (i = 0; i < n; ++i) {
          v(i, j) *= -1.0;
        }
      }
    }

    if (n > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] b;
      delete[] z;
    }
    return 1;
  }